

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

bool has_this(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v,VarId *s)

{
  bool bVar1;
  size_type sVar2;
  reference this;
  VarId *in_RSI;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size(in_RDI);
    if (sVar2 <= (ulong)(long)local_1c) {
      return false;
    }
    this = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
                     (in_RDI,(long)local_1c);
    bVar1 = mir::inst::VarId::operator==(this,in_RSI);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool has_this(vector<mir::inst::VarId> v, mir::inst::VarId s) {
  for (int i = 0; i < v.size(); i++) {
    if (v[i] == s) {
      return true;
    }
  }
  return false;
}